

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O1

int __thiscall cmXMLParser::ParseChunk(cmXMLParser *this,char *inputString,size_type length)

{
  int iVar1;
  
  if (this->Parser == (void *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Parser not initialized",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    iVar1 = 0;
  }
  else {
    iVar1 = (*this->_vptr_cmXMLParser[0xd])(this);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  this->ParseError = 1;
  return iVar1;
}

Assistant:

int cmXMLParser::ParseChunk(const char* inputString,
                            std::string::size_type length)
{
  if (!this->Parser) {
    std::cerr << "Parser not initialized" << std::endl;
    this->ParseError = 1;
    return 0;
  }
  int res;
  res = this->ParseBuffer(inputString, length);
  if (res == 0) {
    this->ParseError = 1;
  }
  return res;
}